

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void ravi_dump_ci(lua_State *L,CallInfo *ci)

{
  StkId pTVar1;
  long lVar2;
  StkId pTVar3;
  ushort uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  uint local_4c;
  StkId pTStack_48;
  int i;
  StkId stack_ptr;
  int funcpos;
  Proto *p;
  StkId base;
  int func_type;
  StkId func;
  CallInfo *ci_local;
  lua_State *L_local;
  
  pTVar1 = ci->func;
  uVar4 = pTVar1->tt_ & 0x7f;
  uVar5 = (ulong)((long)ci->func - (long)L->stack) >> 4;
  if (uVar4 == 6) {
    if (pTVar1->tt_ != 0x8006) {
      __assert_fail("((((func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xa75,"void ravi_dump_ci(lua_State *, CallInfo *)");
    }
    if (((pTVar1->value_).gc)->tt != '\x06') {
      __assert_fail("(((func)->value_).gc)->tt == ((6) | ((0) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xa75,"void ravi_dump_ci(lua_State *, CallInfo *)");
    }
    lVar2 = *(long *)((pTVar1->value_).f + 0x18);
    pTVar1 = (ci->u).l.base;
    local_4c = (uint)((long)ci->top - (long)L->stack >> 4);
    pTVar3 = ci->top;
    while( true ) {
      pTStack_48 = pTVar3 + -1;
      local_4c = local_4c - 1;
      if (pTStack_48 < pTVar1) break;
      pcVar6 = "";
      if (pTStack_48 == pTVar1) {
        pcVar6 = "(base) ";
      }
      pcVar7 = "";
      if (pTStack_48 == L->top) {
        pcVar7 = "(L->top) ";
      }
      printf("stack[%d] reg[%d] = %s %s",(ulong)local_4c,
             (long)pTStack_48 - (long)pTVar1 >> 4 & 0xffffffff,pcVar6,pcVar7);
      if (pTVar3[-1].tt_ == 0x8026) {
        printf("C closure\n");
        pTVar3 = pTStack_48;
      }
      else if (pTVar3[-1].tt_ == 0x16) {
        printf("light C function\n");
        pTVar3 = pTStack_48;
      }
      else if ((pTVar3[-1].tt_ & 0x7f) == 0x46) {
        printf("fast C function\n");
        pTVar3 = pTStack_48;
      }
      else if (pTVar3[-1].tt_ == 0x8006) {
        printf("Lua closure\n");
        pTVar3 = pTStack_48;
      }
      else if ((pTVar3[-1].tt_ & 0xf) == 6) {
        printf("function\n");
        pTVar3 = pTStack_48;
      }
      else if (((pTVar3[-1].tt_ == 0x8014) || (pTVar3[-1].tt_ == 0x8004)) ||
              ((pTVar3[-1].tt_ & 0xf) == 4)) {
        if ((pTVar3[-1].tt_ & 0xf) != 4) {
          __assert_fail("(((((((stack_ptr))->tt_)) & 0x0F)) == (4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xa8a,"void ravi_dump_ci(lua_State *, CallInfo *)");
        }
        if ((((pTStack_48->value_).gc)->tt & 0xf) != 4) {
          __assert_fail("(((((stack_ptr)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xa8a,"void ravi_dump_ci(lua_State *, CallInfo *)");
        }
        printf("\'%s\'\n",(pTStack_48->value_).f + 0x18);
        pTVar3 = pTStack_48;
      }
      else if ((pTVar3[-1].tt_ & 0xf) == 5) {
        printf("table\n");
        pTVar3 = pTStack_48;
      }
      else if (pTVar3[-1].tt_ == 0) {
        printf("nil\n");
        pTVar3 = pTStack_48;
      }
      else if (pTVar3[-1].tt_ == 3) {
        if (pTVar3[-1].tt_ != 3) {
          __assert_fail("((((stack_ptr))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xa90,"void ravi_dump_ci(lua_State *, CallInfo *)");
        }
        printf("%.6f\n",(pTStack_48->value_).gc);
        pTVar3 = pTStack_48;
      }
      else if (pTVar3[-1].tt_ == 0x13) {
        if (pTVar3[-1].tt_ != 0x13) {
          __assert_fail("((((stack_ptr))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xa92,"void ravi_dump_ci(lua_State *, CallInfo *)");
        }
        printf("%lld\n",(pTStack_48->value_).gc);
        pTVar3 = pTStack_48;
      }
      else if (pTVar3[-1].tt_ == 2) {
        printf("light user data\n");
        pTVar3 = pTStack_48;
      }
      else if (pTVar3[-1].tt_ == 0x8007) {
        printf("full user data\n");
        pTVar3 = pTStack_48;
      }
      else if (pTVar3[-1].tt_ == 1) {
        printf("boolean\n");
        pTVar3 = pTStack_48;
      }
      else if (pTVar3[-1].tt_ == 0x8008) {
        printf("thread\n");
        pTVar3 = pTStack_48;
      }
      else {
        printf("other\n");
        pTVar3 = pTStack_48;
      }
    }
    printf("stack[%d] = Lua function (registers = %d, params = %d, locals = %d)\n",
           uVar5 & 0xffffffff,(ulong)*(byte *)(lVar2 + 0xc),(ulong)*(byte *)(lVar2 + 10),
           (ulong)*(uint *)(lVar2 + 0x24));
    printf("---> called from \n");
  }
  else if (uVar4 == 0x16) {
    printf("stack[%d] = Light C function\n",uVar5 & 0xffffffff);
    printf("---> called from \n");
  }
  else if (uVar4 == 0x26) {
    printf("stack[%d] = C closure\n",uVar5 & 0xffffffff);
    printf("---> called from \n");
  }
  else if (uVar4 == 0x46) {
    printf("stack[%d] = Fast C function\n",uVar5 & 0xffffffff);
    printf("---> called from \n");
  }
  return;
}

Assistant:

static void ravi_dump_ci(lua_State *L, CallInfo *ci) {
  StkId func = ci->func;
  int func_type = ttype(func);
  StkId base = NULL;
  Proto *p = NULL;
  int funcpos = (int)(ci->func - L->stack);
  StkId stack_ptr = ci->top - 1;
  int i;
  switch (func_type) {
  case RAVI_TFCF:
	  printf("stack[%d] = Fast C function\n", funcpos);
	  printf("---> called from \n");
	  return;
  case LUA_TLCF:
    printf("stack[%d] = Light C function\n", funcpos);
    printf("---> called from \n");
    return;
  case LUA_TCCL:
    printf("stack[%d] = C closure\n", funcpos);
    printf("---> called from \n");
    return;
  case LUA_TFUNCTION:
    p = clLvalue(func)->p;
    base = ci->u.l.base;
    i = (int) (ci->top - L->stack - 1);
    break;
  default:
    return;
  }
  for (; stack_ptr >= base; stack_ptr--, i--) {
    printf("stack[%d] reg[%d] = %s %s", i, (int)(stack_ptr-base), (stack_ptr == base ? "(base) " : ""), (stack_ptr == L->top ? "(L->top) " : ""));
    if (ttisCclosure(stack_ptr))
      printf("C closure\n");
    else if (ttislcf(stack_ptr))
      printf("light C function\n");
    else if (ttisfcf(stack_ptr))
      printf("fast C function\n");
    else if (ttisLclosure(stack_ptr))
      printf("Lua closure\n");
    else if (ttisfunction(stack_ptr))
      printf("function\n");
    else if (ttislngstring(stack_ptr) || ttisshrstring(stack_ptr) ||
             ttisstring(stack_ptr))
      printf("'%s'\n", svalue(stack_ptr));
    else if (ttistable(stack_ptr))
      printf("table\n");
    else if (ttisnil(stack_ptr))
      printf("nil\n");
    else if (ttisfloat(stack_ptr))
      printf("%.6f\n", fltvalue(stack_ptr));
    else if (ttisinteger(stack_ptr))
      printf("%lld\n", (long long)ivalue(stack_ptr));
    else if (ttislightuserdata(stack_ptr))
      printf("light user data\n");
    else if (ttisfulluserdata(stack_ptr))
      printf("full user data\n");
    else if (ttisboolean(stack_ptr))
      printf("boolean\n");
    else if (ttisthread(stack_ptr))
      printf("thread\n");
    else
      printf("other\n");
  }
  printf(
      "stack[%d] = Lua function (registers = %d, params = %d, locals = %d)\n",
      funcpos, (int)(p->maxstacksize), (int)(p->numparams), p->sizelocvars);
  printf("---> called from \n");
}